

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

size_t slist_size(curl_slist *s,size_t overhead,char *skip,size_t skiplen)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar3 = 0;
  do {
    if (s == (curl_slist *)0x0) {
      return sVar3;
    }
    if (overhead == 0) {
LAB_0014001a:
      sVar2 = strlen(s->data);
      sVar3 = sVar3 + sVar2 + 2;
    }
    else {
      pcVar1 = match_header(s,(char *)overhead,(size_t)skip);
      if (pcVar1 == (char *)0x0) goto LAB_0014001a;
    }
    s = s->next;
  } while( true );
}

Assistant:

static size_t slist_size(struct curl_slist *s,
                         size_t overhead, const char *skip, size_t skiplen)
{
  size_t size = 0;

  for(; s; s = s->next)
    if(!skip || !match_header(s, skip, skiplen))
      size += strlen(s->data) + overhead;
  return size;
}